

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

bool __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::request_slot(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
               *this,size_type slot,
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  pointer pGVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t in_R8;
  size_t sVar6;
  bool bVar7;
  GlobalPtr<int> ptr;
  GlobalPtr<const_BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  src;
  GlobalPtr<int> ptr_00;
  int xor_value;
  HME entry;
  undefined1 local_7c [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
  local_58;
  undefined4 local_3c;
  
  sVar6 = 0;
  bVar7 = false;
  do {
    uVar5 = slot / this->local_capacity_;
    pGVar1 = (this->hash_table_).
             super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptr.rank = pGVar1[uVar5].ptr + (slot % this->local_capacity_) * 0x20 + 0x1c;
    ptr.ptr = sVar6;
    uVar3 = int_compare_and_swap((BCL *)pGVar1[uVar5].rank,ptr,1,(int)in_R8);
    bVar2 = true;
    if ((uint)sVar6 != uVar3) {
      bVar2 = bVar7;
    }
    bVar7 = bVar2;
    if ((uVar3 & 3) != 0) {
      sVar6 = 2;
    }
  } while (!bVar7);
  bVar7 = true;
  if ((uVar3 & 2) != 0) {
    uVar5 = slot / this->local_capacity_;
    bVar7 = false;
    pGVar1 = (this->hash_table_).
             super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58.ptr.rank = 0;
    local_58.ptr.ptr = 0;
    local_58.len = 0;
    local_3c = 0;
    src.ptr = (size_t)&local_58;
    src.rank = (slot % this->local_capacity_) * 0x20 + pGVar1[uVar5].ptr;
    read<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
              ((BCL *)pGVar1[uVar5].rank,src,
               (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                *)0x1,in_R8);
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
    ::get(&local_78,&local_58);
    if (local_78._M_string_length == key->_M_string_length) {
      if (local_78._M_string_length == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(local_78._M_dataplus._M_p,(key->_M_dataplus)._M_p,local_78._M_string_length);
        bVar7 = iVar4 == 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (bVar7 == false) {
      local_7c = (undefined1  [4])0x3;
      uVar5 = slot / this->local_capacity_;
      pGVar1 = (this->hash_table_).
               super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ptr_00.rank = pGVar1[uVar5].ptr + (slot % this->local_capacity_) * 0x20 + 0x1c;
      local_78._M_dataplus._M_p = xor_<int>::vtable + 0x28;
      local_78._M_string_length = 0x10f730;
      local_78.field_2._M_allocated_capacity = 0x10f768;
      ptr_00.ptr = (size_t)local_7c;
      fetch_and_op<int>((BCL *)pGVar1[uVar5].rank,ptr_00,(int *)local_78.field_2._M_local_buf,
                        (atomic_op<int> *)local_7c);
    }
  }
  return bVar7;
}

Assistant:

bool request_slot(size_type slot, const Key& key) {
    bool success = false;
    int current_value = free_flag;
    int return_value;

    do {
      return_value = BCL::int_compare_and_swap(slot_used_ptr(slot),
                                               current_value, reserved_flag);
      if (current_value == return_value) {
        success = true;
      }

      if (return_value & ready_flag || return_value & reserved_flag) {
        current_value = ready_flag;
      }
    } while (!success);

    // At this point, you have slot -> reserved_flag

    if (return_value & ready_flag) {
      HME entry = get_entry(slot);
      if (entry.get_key() == key) {
        return true;
      } else {
        int xor_value = 0x3;
        BCL::fetch_and_op<int>(slot_used_ptr(slot), xor_value, BCL::xor_<int>{});
        return false;
      }
    } else {
      return true;
    }
  }